

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O1

IOTHUB_DEVICE_CLIENT_LL_HANDLE
create_device_client
          (BACK_COMPAT_INFO *back_compat_info,DEVICE_CREATION_TYPE type,
          IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  int iVar1;
  IOTHUB_PROVISIONED_DEVICE *device_info;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE iotHubClientHandle;
  TRANSPORT_HANDLE pTVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  IOTHUB_CLIENT_CONFIG client_config;
  IOTHUB_CLIENT_DEVICE_CONFIG device_config;
  IOTHUB_CLIENT_CONFIG local_78;
  IOTHUB_CLIENT_DEVICE_CONFIG local_40;
  
  device_info = IoTHubAccount_GetSASDevice(back_compat_info->acct_info);
  if (type == DEVICE_CREATION_WITH_TRANSPORT) {
    local_78.iotHubName = (char *)0x0;
    local_78.iotHubSuffix = (char *)0x0;
    local_78.deviceKey = (char *)0x0;
    local_78.deviceSasToken = (char *)0x0;
    local_78.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
    local_78.deviceId = (char *)0x0;
    local_78.protocolGatewayHostName = (char *)0x0;
    iVar1 = parse_connection_string(device_info,&local_78);
    if (iVar1 == 0) {
      pTVar2 = IoTHubTransport_Create(protocol,local_78.iotHubName,local_78.iotHubSuffix);
      back_compat_info->transport_handle = pTVar2;
      if (pTVar2 == (TRANSPORT_HANDLE)0x0) {
        local_40.deviceId = local_78.deviceId;
        local_40.deviceKey = local_78.deviceKey;
        local_40.protocol = protocol;
        local_40.transportHandle = pTVar2;
        IoTHubDeviceClient_LL_CreateWithTransport(&local_40);
      }
      cleanup_config_object(&local_78);
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"create_device_client",0x15b,1,"Failure parsing connection string");
      }
    }
LAB_0011b502:
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_0011b53d:
      iotHubClientHandle = (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0;
      goto LAB_0011b53f;
    }
    pcVar4 = "Failure unknown creation type %d";
    iVar1 = 0x16f;
  }
  else {
    if (type != DEVICE_CREATION_CREATE) {
      if (type == DEVICE_CREATION_CONN_STRING) {
        iotHubClientHandle =
             IoTHubDeviceClient_LL_CreateFromConnectionString
                       (device_info->connectionString,protocol);
        goto LAB_0011b53f;
      }
      goto LAB_0011b502;
    }
    local_78.iotHubName = (char *)0x0;
    local_78.iotHubSuffix = (char *)0x0;
    local_78.deviceKey = (char *)0x0;
    local_78.deviceSasToken = (char *)0x0;
    local_78.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
    local_78.deviceId = (char *)0x0;
    local_78.protocolGatewayHostName = (char *)0x0;
    iVar1 = parse_connection_string(device_info,&local_78);
    if (iVar1 == 0) {
      local_78.protocol = protocol;
      iotHubClientHandle = IoTHubDeviceClient_LL_Create(&local_78);
      cleanup_config_object(&local_78);
      goto LAB_0011b53f;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011b53d;
    pcVar4 = "Failure parsing connection string";
    iVar1 = 0x14b;
  }
  iotHubClientHandle = (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0;
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
            ,"create_device_client",iVar1,1,pcVar4);
LAB_0011b53f:
  if (iotHubClientHandle != (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    local_78.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)CONCAT71(local_78.protocol._1_7_,1);
    IoTHubDeviceClient_LL_SetOption(iotHubClientHandle,"logtrace",&local_78);
  }
  return iotHubClientHandle;
}

Assistant:

static IOTHUB_DEVICE_CLIENT_LL_HANDLE create_device_client(BACK_COMPAT_INFO* back_compat_info, DEVICE_CREATION_TYPE type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_DEVICE_CLIENT_LL_HANDLE result;

    IOTHUB_PROVISIONED_DEVICE* device_info = IoTHubAccount_GetSASDevice(back_compat_info->acct_info);

    switch (type)
    {
        case DEVICE_CREATION_CONN_STRING:
            result = IoTHubDeviceClient_LL_CreateFromConnectionString(device_info->connectionString, protocol);
            break;
        case DEVICE_CREATION_CREATE:
        {
            IOTHUB_CLIENT_CONFIG client_config = { 0 };
            if (parse_connection_string(device_info, &client_config) != 0)
            {
                LogError("Failure parsing connection string");
                result = NULL;
            }
            else
            {
                client_config.protocol = protocol;
                result = IoTHubDeviceClient_LL_Create(&client_config);
                cleanup_config_object(&client_config);
            }
            break;
        }
        case DEVICE_CREATION_WITH_TRANSPORT:
        {
            IOTHUB_CLIENT_CONFIG client_config = { 0 };
            if (parse_connection_string(device_info, &client_config) != 0)
            {
                LogError("Failure parsing connection string");
                result = NULL;
            }
            else
            {
                if ((back_compat_info->transport_handle = IoTHubTransport_Create(protocol, client_config.iotHubName, client_config.iotHubSuffix)) == NULL)
                {
                    IOTHUB_CLIENT_DEVICE_CONFIG device_config;
                    device_config.deviceId = client_config.deviceId;
                    device_config.deviceKey = client_config.deviceKey;
                    device_config.protocol = protocol;
                    device_config.transportHandle = back_compat_info->transport_handle;

                    result = IoTHubDeviceClient_LL_CreateWithTransport(&device_config);
                }
                cleanup_config_object(&client_config);
            }
        }
        default:
        {
            LogError("Failure unknown creation type %d", (int)type);
            result = NULL;
            break;
        }
    }
    // Always set the log trace option
    if (result != NULL)
    {
        bool trace_on = true;
        IoTHubDeviceClient_LL_SetOption(result, OPTION_LOG_TRACE, &trace_on);
    }
    return result;
}